

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

void __thiscall wasm::Try::finalize(Try *this)

{
  initializer_list<wasm::Type> __l;
  bool bVar1;
  size_t __n;
  Expression **ppEVar2;
  Type TVar3;
  Iterator IVar4;
  Expression *catchBody;
  Iterator __end1;
  Iterator __begin1;
  ExpressionList *__range1;
  allocator<wasm::Type> local_63;
  key_equal local_62;
  hasher local_61;
  Type local_60;
  iterator local_58;
  size_type local_50;
  undefined1 local_48 [8];
  unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>
  types;
  Try *this_local;
  
  local_60.id = (this->body->type).id;
  local_58 = &local_60;
  local_50 = 1;
  types._M_h._M_single_bucket = (__node_base_ptr)this;
  std::allocator<wasm::Type>::allocator(&local_63);
  __l._M_len = local_50;
  __l._M_array = local_58;
  std::
  unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>
  ::unordered_set((unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>
                   *)local_48,__l,0,&local_61,&local_62,&local_63);
  std::allocator<wasm::Type>::~allocator(&local_63);
  __n = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                  (&(this->catchBodies).
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
  std::
  unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>
  ::reserve((unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>
             *)local_48,__n);
  IVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                    (&(this->catchBodies).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
  __end1.index = (size_t)IVar4.parent;
  IVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                    (&(this->catchBodies).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
  while( true ) {
    __end1.parent = (ArenaVector<wasm::Expression_*> *)IVar4.index;
    catchBody = (Expression *)IVar4.parent;
    bVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
            operator!=((Iterator *)&__end1.index,(Iterator *)&catchBody);
    if (!bVar1) break;
    ppEVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
              operator*((Iterator *)&__end1.index);
    std::
    unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>
    ::insert((unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>
              *)local_48,&(*ppEVar2)->type);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
              ((Iterator *)&__end1.index);
    IVar4.index = (size_t)__end1.parent;
    IVar4.parent = (ArenaVector<wasm::Expression_*> *)catchBody;
  }
  TVar3 = wasm::Type::
          getLeastUpperBound<std::unordered_set<wasm::Type,std::hash<wasm::Type>,std::equal_to<wasm::Type>,std::allocator<wasm::Type>>>
                    ((unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>
                      *)local_48);
  (this->super_SpecificExpression<(wasm::Expression::Id)49>).super_Expression.type.id = TVar3.id;
  std::
  unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>
  ::~unordered_set((unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>
                    *)local_48);
  return;
}

Assistant:

void Try::finalize() {
  // If none of the component bodies' type is a supertype of the others, assume
  // the current type is already correct. TODO: Calculate a proper LUB.
  std::unordered_set<Type> types{body->type};
  types.reserve(catchBodies.size());
  for (auto catchBody : catchBodies) {
    types.insert(catchBody->type);
  }
  type = Type::getLeastUpperBound(types);
}